

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_type1.c
# Opt level: O1

HPDF_STATUS HPDF_Type1FontDef_SetWidths(HPDF_FontDef fontdef,HPDF_CharData *widths)

{
  HPDF_UNICODE HVar1;
  short sVar2;
  void *pvVar3;
  int iVar4;
  void *s;
  HPDF_STATUS HVar5;
  HPDF_UNICODE *pHVar6;
  long lVar7;
  
  pvVar3 = fontdef->attr;
  HPDF_FreeMem(fontdef->mmgr,*(void **)((long)pvVar3 + 8));
  *(undefined8 *)((long)pvVar3 + 8) = 0;
  fontdef->valid = 0;
  if (widths->unicode == 0xffff) {
    iVar4 = 0;
  }
  else {
    pHVar6 = &widths[1].unicode;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + 1;
      HVar1 = *pHVar6;
      pHVar6 = pHVar6 + 3;
    } while (HVar1 != 0xffff);
  }
  *(int *)((long)pvVar3 + 0x10) = iVar4;
  s = HPDF_GetMem(fontdef->mmgr,iVar4 * 6);
  if (s == (void *)0x0) {
    HVar5 = HPDF_Error_GetCode(fontdef->error);
    return HVar5;
  }
  HPDF_MemSet(s,'\0',*(int *)((long)pvVar3 + 0x10) * 6);
  *(void **)((long)pvVar3 + 8) = s;
  iVar4 = *(int *)((long)pvVar3 + 0x10);
  if (iVar4 != 0) {
    lVar7 = 0;
    do {
      *(undefined2 *)((long)s + lVar7) = *(undefined2 *)((long)&widths->char_cd + lVar7);
      sVar2 = *(short *)((long)&widths->unicode + lVar7);
      *(short *)((long)s + lVar7 + 2) = sVar2;
      *(undefined2 *)((long)s + lVar7 + 4) = *(undefined2 *)((long)&widths->width + lVar7);
      if (sVar2 == 0x20) {
        fontdef->missing_width = *(HPDF_INT16 *)((long)&widths->width + lVar7);
      }
      lVar7 = lVar7 + 6;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

HPDF_STATUS
HPDF_Type1FontDef_SetWidths  (HPDF_FontDef          fontdef,
                              const HPDF_CharData*  widths)
{
    const HPDF_CharData* src = widths;
    HPDF_Type1FontDefAttr attr = (HPDF_Type1FontDefAttr)fontdef->attr;
    HPDF_CharData* dst;
    HPDF_UINT i = 0;

    HPDF_PTRACE ((" HPDF_Type1FontDef_SetWidths\n"));

    FreeWidth (fontdef);

    while (src->unicode != 0xFFFF) {
        src++;
        i++;
    }

    attr->widths_count = i;

    dst = (HPDF_CharData*)HPDF_GetMem (fontdef->mmgr, sizeof(HPDF_CharData) *
            attr->widths_count);
    if (dst == NULL)
        return HPDF_Error_GetCode (fontdef->error);

    HPDF_MemSet (dst, 0, sizeof(HPDF_CharData) * attr->widths_count);
    attr->widths = dst;

    src = widths;
    for (i = 0; i < attr->widths_count; i++) {
        dst->char_cd = src->char_cd;
        dst->unicode = src->unicode;
        dst->width = src->width;
        if (dst->unicode == 0x0020) {
            fontdef->missing_width = src->width;
        }

        src++;
        dst++;
    }

    return HPDF_OK;
}